

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::beta_dist<long_double>::pdf
          (result_type_conflict3 *__return_storage_ptr__,beta_dist<long_double> *this,
          result_type_conflict3 x)

{
  longdouble lVar1;
  longdouble lVar2;
  undefined8 in_RAX;
  result_type_conflict3 *prVar3;
  
  prVar3 = (result_type_conflict3 *)CONCAT71((int7)((ulong)in_RAX >> 8),x._0_10_ < (longdouble)0);
  lVar1 = (longdouble)1;
  if (x._0_10_ <= lVar1 && x._0_10_ >= (longdouble)0) {
    lVar2 = (longdouble)0;
    if ((x._0_10_ != lVar2) || (lVar2 <= -lVar1 + *(longdouble *)__return_storage_ptr__)) {
      if ((x._0_10_ != lVar1) ||
         ((NAN(x._0_10_) || NAN(lVar1) ||
          (lVar2 <= -lVar1 + *(longdouble *)(__return_storage_ptr__ + 1))))) {
        powl();
        prVar3 = (result_type_conflict3 *)powl();
        return prVar3;
      }
    }
    prVar3 = (result_type_conflict3 *)__errno_location();
    *(int *)prVar3 = 0x21;
  }
  return prVar3;
}

Assistant:

pdf(result_type x) const {
      if (x < 0 or x > 1)
        return 0;
      if ((x == 0 and P.alpha() - 1 < 0) or (x == 1 and P.beta() - 1 < 0)) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return 1 / P.norm() * math::pow(x, P.alpha() - 1) * math::pow(1 - x, P.beta() - 1);
    }